

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O1

void non_empty_opendir_cb(uv_fs_t *req)

{
  void *dir;
  int iVar1;
  uv_loop_t *loop;
  uv_loop_t *puVar2;
  uv_loop_t *unaff_RBX;
  uv_fs_t *puVar3;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_38 [16];
  undefined1 auStack_28 [24];
  uv__queue *local_10;
  
  puVar2 = (uv_loop_t *)opendir_req.ptr;
  if (req == &opendir_req) {
    local_10 = (uv__queue *)(long)opendir_req.fs_type;
    auStack_28._16_8_ = (uv__queue *)0x1f;
    if (local_10 != (uv__queue *)0x1f) goto LAB_00188f2a;
    local_10 = (uv__queue *)opendir_req.result;
    auStack_28._16_8_ = (uv__queue *)0x0;
    if (opendir_req.result != 0) goto LAB_00188f37;
    if (opendir_req.ptr == (void *)0x0) goto LAB_00188f44;
    *(uv_dirent_t **)opendir_req.ptr = dirents;
    *(undefined8 *)((long)puVar2 + 8) = 1;
    auStack_28._8_8_ = (uv_loop_t *)0x188eda;
    loop = uv_default_loop();
    auStack_28._8_8_ = (uv_loop_t *)0x188ef3;
    iVar1 = uv_fs_readdir(loop,&readdir_req,(uv_dir_t *)puVar2,non_empty_readdir_cb);
    local_10 = (uv__queue *)(long)iVar1;
    auStack_28._16_8_ = (uv__queue *)0x0;
    if (local_10 == (uv__queue *)0x0) {
      auStack_28._8_8_ = (uv_loop_t *)0x188f19;
      uv_fs_req_cleanup(&opendir_req);
      non_empty_opendir_cb_count = non_empty_opendir_cb_count + 1;
      return;
    }
  }
  else {
    auStack_28._8_8_ = (uv_loop_t *)0x188f2a;
    non_empty_opendir_cb_cold_1();
LAB_00188f2a:
    auStack_28._8_8_ = (uv_loop_t *)0x188f37;
    non_empty_opendir_cb_cold_2();
LAB_00188f37:
    auStack_28._8_8_ = (uv_loop_t *)0x188f44;
    non_empty_opendir_cb_cold_3();
    puVar2 = unaff_RBX;
LAB_00188f44:
    auStack_28._8_8_ = (uv_loop_t *)0x188f49;
    non_empty_opendir_cb_cold_5();
  }
  puVar3 = (uv_fs_t *)&stack0xfffffffffffffff0;
  auStack_28._8_8_ = empty_readdir_cb;
  non_empty_opendir_cb_cold_4();
  dir = readdir_req.ptr;
  auStack_28._8_8_ = puVar2;
  if (puVar3 == &readdir_req) {
    auStack_28._0_8_ = SEXT48(readdir_req.fs_type);
    auStack_38._8_8_ = (uv_loop_t *)0x20;
    if ((void *)auStack_28._0_8_ != (void *)0x20) goto LAB_00188fff;
    auStack_28._0_8_ = readdir_req.result;
    auStack_38._8_8_ = (uv_loop_t *)0x0;
    if (readdir_req.result != 0) goto LAB_0018900c;
    auStack_38._0_8_ = (void *)0x188fbc;
    uv_fs_req_cleanup(&readdir_req);
    auStack_38._0_8_ = (void *)0x188fc1;
    puVar2 = uv_default_loop();
    auStack_38._0_8_ = (void *)0x188fda;
    iVar1 = uv_fs_closedir(puVar2,&closedir_req,(uv_dir_t *)dir,empty_closedir_cb);
    auStack_28._0_8_ = SEXT48(iVar1);
    auStack_38._8_8_ = (uv_loop_t *)0x0;
    if ((void *)auStack_28._0_8_ == (void *)0x0) {
      return;
    }
  }
  else {
    auStack_38._0_8_ = (void *)0x188fff;
    empty_readdir_cb_cold_1();
LAB_00188fff:
    auStack_38._0_8_ = (void *)0x18900c;
    empty_readdir_cb_cold_2();
LAB_0018900c:
    auStack_38._0_8_ = (void *)0x189019;
    empty_readdir_cb_cold_3();
  }
  puVar3 = (uv_fs_t *)auStack_28;
  auStack_38._0_8_ = empty_closedir_cb;
  empty_readdir_cb_cold_4();
  if (puVar3 == &closedir_req) {
    auStack_38._0_8_ = SEXT48(closedir_req.fs_type);
    if ((code *)auStack_38._0_8_ == (code *)0x21) {
      auStack_38._0_8_ = closedir_req.result;
      if (closedir_req.result == 0) {
        empty_closedir_cb_count = empty_closedir_cb_count + 1;
        uv_fs_req_cleanup(&closedir_req);
        return;
      }
      goto LAB_001890a2;
    }
  }
  else {
    empty_closedir_cb_cold_1();
  }
  empty_closedir_cb_cold_2();
LAB_001890a2:
  handle = (uv_handle_t *)auStack_38;
  empty_closedir_cb_cold_3();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return;
}

Assistant:

static void non_empty_opendir_cb(uv_fs_t* req) {
  uv_dir_t* dir;
  int r;

  ASSERT_PTR_EQ(req, &opendir_req);
  ASSERT_EQ(req->fs_type, UV_FS_OPENDIR);
  ASSERT_OK(req->result);
  ASSERT_NOT_NULL(req->ptr);

  dir = req->ptr;
  dir->dirents = dirents;
  dir->nentries = ARRAY_SIZE(dirents);

  r = uv_fs_readdir(uv_default_loop(),
                    &readdir_req,
                    dir,
                    non_empty_readdir_cb);
  ASSERT_OK(r);
  uv_fs_req_cleanup(req);
  ++non_empty_opendir_cb_count;
}